

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

int Cba_ObjAttrSize(Cba_Ntk_t *p,int i)

{
  uint uVar1;
  int iVar2;
  
  if (i < 0) {
    __assert_fail("i>=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                  ,0xf3,"int Cba_ObjAttrSize(Cba_Ntk_t *, int)");
  }
  if ((p->vObjAttr).nSize < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    Vec_IntFillExtra(&p->vObjAttr,i + 1,0);
    if ((p->vObjAttr).nSize <= i) {
LAB_003ace1b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((p->vObjAttr).pArray[(uint)i] != 0) {
      if ((p->vObjAttr).nSize < 1) {
        uVar1 = 0;
      }
      else {
        Vec_IntFillExtra(&p->vObjAttr,i + 1,0);
        if ((p->vObjAttr).nSize <= i) goto LAB_003ace1b;
        uVar1 = (p->vObjAttr).pArray[(uint)i];
      }
      if (((int)uVar1 < 0) || ((p->vAttrSto).nSize <= (int)uVar1)) goto LAB_003ace1b;
      iVar2 = (p->vAttrSto).pArray[uVar1];
    }
  }
  return iVar2;
}

Assistant:

static inline int            Cba_ObjAttrSize( Cba_Ntk_t * p, int i )         { assert(i>=0); return Cba_ObjAttr(p, i) ? Vec_IntEntry(&p->vAttrSto, Cba_ObjAttr(p, i)) : 0; }